

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommonArgProperties<Catch::ConfigData>::~CommonArgProperties
          (CommonArgProperties<Catch::ConfigData> *this)

{
  CommonArgProperties<Catch::ConfigData> *this_local;
  
  std::__cxx11::string::~string((string *)&this->placeholder);
  std::__cxx11::string::~string((string *)&this->detail);
  std::__cxx11::string::~string((string *)&this->description);
  Detail::BoundArgFunction<Catch::ConfigData>::~BoundArgFunction(&this->boundField);
  return;
}

Assistant:

CommonArgProperties( Detail::BoundArgFunction<ConfigT> const& _boundField ) : boundField( _boundField ) {}